

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

void makeTiled(char *inFileName,char *outFileName,int partnum,LevelMode mode,
              LevelRoundingMode roundingMode,Compression compression,int tileSizeX,int tileSizeY,
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *doNotFilter,Extrapolation extX,Extrapolation extY,bool verbose)

{
  Slice *pSVar1;
  undefined4 uVar2;
  char *pcVar3;
  byte bVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ostream *poVar12;
  Header *pHVar13;
  NoImplExc *this;
  InputExc *this_00;
  ImageChannel *pIVar14;
  long lVar15;
  undefined4 *puVar16;
  reference pvVar17;
  size_type sVar18;
  string *psVar19;
  LevelMode in_ECX;
  _Rb_tree_color in_EDX;
  char *in_RSI;
  char *in_RDI;
  LevelRoundingMode in_R8D;
  undefined4 in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  byte in_stack_00000030;
  DeepTiledOutputPart out_4;
  DeepTiledInputPart in_4;
  DeepScanLineOutputPart out_3;
  DeepScanLineInputPart in_3;
  OutputPart out_2;
  InputPart in_2;
  TiledOutputPart out_1;
  TiledInputPart in_1;
  string type;
  Header header_1;
  exception *e;
  int lx;
  int ly;
  Image *iptr2;
  Image *iptr1;
  Image *iptr0;
  int l;
  int x;
  int y;
  TiledOutputPart out;
  int p_1;
  MultiPartOutputFile output;
  Header h;
  int chunkcount;
  Channel *channel;
  char *name;
  ConstIterator i;
  InputPart in;
  int p;
  int parts;
  MultiPartInputFile input;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  FrameBuffer fb;
  Header header;
  Image image2;
  Image image1;
  Image image0;
  string *in_stack_fffffffffffff928;
  Image *in_stack_fffffffffffff930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff938;
  Image *in_stack_fffffffffffff940;
  int in_stack_fffffffffffff948;
  Extrapolation in_stack_fffffffffffff94c;
  Image *in_stack_fffffffffffff950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff970;
  PixelType in_stack_fffffffffffff984;
  string *in_stack_fffffffffffff988;
  Image *in_stack_fffffffffffff990;
  Header *in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  TiledOutputPart *in_stack_fffffffffffffa50;
  DeepTiledOutputPart local_4a8 [8];
  DeepTiledInputPart local_4a0 [8];
  DeepScanLineOutputPart local_498 [8];
  Image *in_stack_fffffffffffffb70;
  Image *in_stack_fffffffffffffb78;
  InputPart local_480 [3];
  undefined1 in_stack_fffffffffffffb83;
  Extrapolation in_stack_fffffffffffffb84;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb88;
  ChannelList *in_stack_fffffffffffffb90;
  string local_468 [32];
  Header local_448 [64];
  undefined1 local_408 [16];
  int local_3f8;
  undefined1 local_3f4 [16];
  int local_3e4;
  Image *local_3e0;
  Image *local_3d8;
  Image *local_3d0;
  undefined1 local_3c4 [16];
  undefined1 local_3b4 [16];
  int local_3a4;
  int local_3a0;
  int local_39c;
  undefined1 local_398 [32];
  Header local_378 [60];
  undefined4 local_33c;
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [36];
  TileDescription local_2b4;
  allocator<char> local_2a1;
  string local_2a0 [32];
  undefined1 local_280 [63];
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [32];
  Channel *local_1d0;
  Slice *local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b0;
  undefined1 local_1a0 [32];
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_180;
  char local_168 [48];
  Vec2<float> local_138;
  TileDescription local_130 [3];
  Image local_f8;
  Image local_a8;
  Image local_68;
  byte local_21;
  undefined4 local_20;
  LevelRoundingMode local_1c;
  LevelMode local_18;
  _Rb_tree_color local_14;
  char *local_10;
  char *local_8;
  
  local_21 = in_stack_00000030 & 1;
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Image::Image(in_stack_fffffffffffff940);
  Image::Image(in_stack_fffffffffffff940);
  Image::Image(in_stack_fffffffffffff940);
  Imath_3_2::Vec2<float>::Vec2(&local_138,0.0,0.0);
  Imf_3_2::Header::Header
            ((Header *)local_130,0x40,0x40,1.0,(Vec2 *)&local_138,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x10b222);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
            ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)0x10b22f);
  pcVar3 = local_8;
  iVar7 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)(local_1a0 + 0x10),pcVar3,iVar7,true);
  local_1a0._12_4_ = Imf_3_2::MultiPartInputFile::parts();
  local_1a0._8_4_ = _S_red;
  do {
    pcVar3 = local_10;
    if ((int)local_1a0._12_4_ <= (int)local_1a0._8_4_) {
      pvVar17 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
                          (&local_180,0);
      sVar18 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::size(&local_180);
      iVar7 = (int)sVar18;
      iVar8 = Imf_3_2::globalThreadCount();
      Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
                ((MultiPartOutputFile *)(local_398 + 0x10),pcVar3,pvVar17,iVar7,false,iVar8);
      for (local_398._12_4_ = _S_red; (int)local_398._12_4_ < (int)local_1a0._12_4_;
          local_398._12_4_ = local_398._12_4_ + _S_black) {
        if (local_398._12_4_ == local_14) {
          Imf_3_2::TiledOutputPart::TiledOutputPart
                    ((TiledOutputPart *)local_398,(MultiPartOutputFile *)(local_398 + 0x10),local_14
                    );
          Imf_3_2::TiledOutputPart::setFrameBuffer((FrameBuffer *)local_398);
          if ((local_21 & 1) != 0) {
            poVar12 = std::operator<<((ostream *)&std::cout,"writing file ");
            poVar12 = std::operator<<(poVar12,local_10);
            poVar12 = std::operator<<(poVar12,"\nlevel (0, 0)");
            std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
          }
          for (local_39c = 0; iVar11 = local_39c,
              iVar9 = Imf_3_2::TiledOutputPart::numYTiles((int)local_398), iVar11 < iVar9;
              local_39c = local_39c + 1) {
            for (local_3a0 = 0; iVar11 = local_3a0,
                iVar9 = Imf_3_2::TiledOutputPart::numXTiles((int)local_398), iVar11 < iVar9;
                local_3a0 = local_3a0 + 1) {
              Imf_3_2::TiledOutputPart::writeTile((int)local_398,local_3a0,local_39c);
            }
          }
          if (local_18 == MIPMAP_LEVELS) {
            for (local_3a4 = 1; iVar11 = local_3a4, iVar9 = Imf_3_2::TiledOutputPart::numLevels(),
                iVar11 < iVar9; local_3a4 = local_3a4 + 1) {
              Imf_3_2::TiledOutputPart::dataWindowForLevel((int)local_3b4,(int)local_398);
              Image::resize(in_stack_fffffffffffff950,
                            (Box2i *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
              Imf_3_2::Header::channels();
              anon_unknown.dwarf_16f66::reduceX
                        (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb84,(bool)in_stack_fffffffffffffb83,
                         in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
              Imf_3_2::TiledOutputPart::dataWindowForLevel((int)local_3c4,(int)local_398);
              Image::resize(in_stack_fffffffffffff950,
                            (Box2i *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
              Imf_3_2::Header::channels();
              anon_unknown.dwarf_16f66::reduceY
                        (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb84,(bool)in_stack_fffffffffffffb83,
                         in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
              if ((local_21 & 1) != 0) {
                poVar12 = std::operator<<((ostream *)&std::cout,"level (");
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_3a4);
                poVar12 = std::operator<<(poVar12,", ");
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_3a4);
                poVar12 = std::operator<<(poVar12,")");
                std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
              }
              Imf_3_2::Header::channels();
              anon_unknown.dwarf_16f66::storeLevel
                        (in_stack_fffffffffffffa50,
                         (ChannelList *)
                         CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                         (int)((ulong)in_stack_fffffffffffffa40 >> 0x20),
                         (int)in_stack_fffffffffffffa40,(Image *)CONCAT44(iVar8,iVar7));
            }
          }
          if (local_18 == RIPMAP_LEVELS) {
            local_3d0 = &local_68;
            local_3d8 = &local_a8;
            local_3e0 = &local_f8;
            for (local_3e4 = 0; iVar11 = local_3e4, iVar10 = Imf_3_2::TiledOutputPart::numYLevels(),
                iVar9 = local_3e4, iVar11 < iVar10; local_3e4 = local_3e4 + 1) {
              iVar11 = Imf_3_2::TiledOutputPart::numYLevels();
              if (iVar9 < iVar11 + -1) {
                Imf_3_2::TiledOutputPart::dataWindowForLevel((int)local_3f4,(int)local_398);
                Image::resize(in_stack_fffffffffffff950,
                              (Box2i *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948)
                             );
                Imf_3_2::Header::channels();
                anon_unknown.dwarf_16f66::reduceY
                          (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                           in_stack_fffffffffffffb84,(bool)in_stack_fffffffffffffb83,
                           in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
              }
              for (local_3f8 = 0; iVar11 = local_3f8, iVar9 = Imf_3_2::TiledOutputPart::numXLevels()
                  , iVar11 < iVar9; local_3f8 = local_3f8 + 1) {
                if ((local_3f8 != 0) || (local_3e4 != 0)) {
                  if ((local_21 & 1) != 0) {
                    poVar12 = std::operator<<((ostream *)&std::cout,"level (");
                    poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_3f8);
                    poVar12 = std::operator<<(poVar12,", ");
                    poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_3e4);
                    poVar12 = std::operator<<(poVar12,")");
                    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
                  }
                  in_stack_fffffffffffff950 = (Image *)Imf_3_2::Header::channels();
                  anon_unknown.dwarf_16f66::storeLevel
                            (in_stack_fffffffffffffa50,
                             (ChannelList *)
                             CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                             (int)((ulong)in_stack_fffffffffffffa40 >> 0x20),
                             (int)in_stack_fffffffffffffa40,(Image *)CONCAT44(iVar8,iVar7));
                }
                in_stack_fffffffffffff948 = local_3f8;
                in_stack_fffffffffffff94c = Imf_3_2::TiledOutputPart::numXLevels();
                if (in_stack_fffffffffffff948 < (int)(in_stack_fffffffffffff94c - CLAMP)) {
                  in_stack_fffffffffffff940 = local_3d8;
                  Imf_3_2::TiledOutputPart::dataWindowForLevel((int)local_408,(int)local_398);
                  Image::resize(in_stack_fffffffffffff950,
                                (Box2i *)CONCAT44(in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948));
                  Imf_3_2::Header::channels();
                  anon_unknown.dwarf_16f66::reduceX
                            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                             in_stack_fffffffffffffb84,(bool)in_stack_fffffffffffffb83,
                             in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
                  std::swap<Image*>(&local_3d0,&local_3d8);
                }
              }
              std::swap<Image*>(&local_3e0,&local_3d0);
            }
          }
        }
        else {
          pvVar17 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
                              (&local_180,(long)(int)local_398._12_4_);
          Imf_3_2::Header::Header(local_448,pvVar17);
          psVar19 = (string *)Imf_3_2::Header::type_abi_cxx11_();
          std::__cxx11::string::string(local_468,psVar19);
          _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff950,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
          if (_Var6) {
            Imf_3_2::TiledInputPart::TiledInputPart
                      ((TiledInputPart *)&stack0xfffffffffffffb90,
                       (MultiPartInputFile *)(local_1a0 + 0x10),local_398._12_4_);
            Imf_3_2::TiledOutputPart::TiledOutputPart
                      ((TiledOutputPart *)&stack0xfffffffffffffb88,
                       (MultiPartOutputFile *)(local_398 + 0x10),local_398._12_4_);
            Imf_3_2::TiledOutputPart::copyPixels((TiledInputPart *)&stack0xfffffffffffffb88);
          }
          else {
            _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff950,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948)
                                   );
            if (_Var6) {
              Imf_3_2::InputPart::InputPart
                        (local_480,(MultiPartInputFile *)(local_1a0 + 0x10),local_398._12_4_);
              Imf_3_2::OutputPart::OutputPart
                        ((OutputPart *)&stack0xfffffffffffffb78,
                         (MultiPartOutputFile *)(local_398 + 0x10),local_398._12_4_);
              Imf_3_2::OutputPart::copyPixels((InputPart *)&stack0xfffffffffffffb78);
            }
            else {
              _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff950,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948));
              if (_Var6) {
                Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                          ((DeepScanLineInputPart *)&stack0xfffffffffffffb70,
                           (MultiPartInputFile *)(local_1a0 + 0x10),local_398._12_4_);
                Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
                          (local_498,(MultiPartOutputFile *)(local_398 + 0x10),local_398._12_4_);
                Imf_3_2::DeepScanLineOutputPart::copyPixels((DeepScanLineInputPart *)local_498);
              }
              else {
                _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffff950,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffff94c,
                                                    in_stack_fffffffffffff948));
                if (_Var6) {
                  Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                            (local_4a0,(MultiPartInputFile *)(local_1a0 + 0x10),local_398._12_4_);
                  Imf_3_2::DeepTiledOutputPart::DeepTiledOutputPart
                            (local_4a8,(MultiPartOutputFile *)(local_398 + 0x10),local_398._12_4_);
                  Imf_3_2::DeepTiledOutputPart::copyPixels((DeepTiledInputPart *)local_4a8);
                }
              }
            }
          }
          std::__cxx11::string::~string(local_468);
          Imf_3_2::Header::~Header(local_448);
        }
      }
      if ((local_21 & 1) != 0) {
        poVar12 = std::operator<<((ostream *)&std::cout,"done.");
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
      }
      Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)(local_398 + 0x10));
      Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)(local_1a0 + 0x10));
      std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector
                ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                 in_stack_fffffffffffff940);
      Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x10c953);
      Imf_3_2::Header::~Header((Header *)local_130);
      Image::~Image(in_stack_fffffffffffff940);
      Image::~Image(in_stack_fffffffffffff940);
      Image::~Image(in_stack_fffffffffffff940);
      return;
    }
    if ((local_21 & 1) != 0) {
      poVar12 = std::operator<<((ostream *)&std::cout,"reading file ");
      poVar12 = std::operator<<(poVar12,local_8);
      std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    }
    if (local_1a0._8_4_ == local_14) {
      Imf_3_2::InputPart::InputPart
                ((InputPart *)local_1a0,(MultiPartInputFile *)(local_1a0 + 0x10),local_1a0._8_4_);
      pHVar13 = (Header *)Imf_3_2::InputPart::header();
      Imf_3_2::Header::operator=((Header *)local_130,pHVar13);
      bVar4 = Imf_3_2::hasEnvmap((Header *)local_130);
      if (((bVar4 & 1) != 0) && (local_18 != ONE_LEVEL)) {
        this = (NoImplExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::NoImplExc::NoImplExc
                  (this,
                   "This program cannot generate multiresolution environment maps.  Use exrenvmap instead."
                  );
        __cxa_throw(this,&Iex_3_2::NoImplExc::typeinfo,Iex_3_2::NoImplExc::~NoImplExc);
      }
      Imf_3_2::Header::dataWindow();
      Image::resize(in_stack_fffffffffffff950,
                    (Box2i *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
      Imf_3_2::Header::channels();
      local_1b0 = Imf_3_2::ChannelList::begin();
      Imf_3_2::ChannelList::ConstIterator::ConstIterator
                ((ConstIterator *)in_stack_fffffffffffff930,(Iterator *)in_stack_fffffffffffff928);
      while( true ) {
        Imf_3_2::Header::channels();
        local_1c0 = Imf_3_2::ChannelList::end();
        Imf_3_2::ChannelList::ConstIterator::ConstIterator
                  ((ConstIterator *)in_stack_fffffffffffff930,(Iterator *)in_stack_fffffffffffff928)
        ;
        bVar5 = Imf_3_2::operator!=((ConstIterator *)in_stack_fffffffffffff930,
                                    (ConstIterator *)in_stack_fffffffffffff928);
        if (!bVar5) break;
        local_1c8 = (Slice *)Imf_3_2::ChannelList::ConstIterator::name((ConstIterator *)0x10b5a0);
        local_1d0 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x10b5c7);
        if ((*(int *)(local_1d0 + 4) != 1) || (*(int *)(local_1d0 + 8) != 1)) {
          this_00 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc
                    (this_00,"Sub-sampled image channels are not supported in tiled files.");
          __cxa_throw(this_00,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,
                   (allocator<char> *)in_stack_fffffffffffff960);
        Image::addChannel(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                          in_stack_fffffffffffff984);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator(&local_1f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,
                   (allocator<char> *)in_stack_fffffffffffff960);
        Image::addChannel(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                          in_stack_fffffffffffff984);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator(&local_219);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,
                   (allocator<char> *)in_stack_fffffffffffff960);
        Image::addChannel(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                          in_stack_fffffffffffff984);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator(&local_241);
        pSVar1 = local_1c8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,
                   (allocator<char> *)in_stack_fffffffffffff960);
        pIVar14 = Image::channel(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
        (*pIVar14->_vptr_ImageChannel[2])(local_280);
        Imf_3_2::FrameBuffer::insert(local_168,pSVar1);
        std::__cxx11::string::~string(local_2a0);
        std::allocator<char>::~allocator(&local_2a1);
        Imf_3_2::ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffff930);
      }
      Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)local_1a0);
      lVar15 = Imf_3_2::Header::dataWindow();
      iVar7 = *(int *)(lVar15 + 4);
      Imf_3_2::Header::dataWindow();
      Imf_3_2::InputPart::readPixels((int)local_1a0,iVar7);
      Imf_3_2::TileDescription::TileDescription
                (&local_2b4,in_stack_00000008,in_stack_00000010,local_18,local_1c);
      Imf_3_2::Header::setTileDescription(local_130);
      uVar2 = local_20;
      puVar16 = (undefined4 *)Imf_3_2::Header::compression();
      *puVar16 = uVar2;
      in_stack_fffffffffffffa50 = (TiledOutputPart *)Imf_3_2::Header::lineOrder();
      *(undefined4 *)in_stack_fffffffffffffa50 = 0;
      if (local_18 != ONE_LEVEL) {
        (anonymous_namespace)::extToString_abi_cxx11_(in_stack_fffffffffffff94c);
        std::operator+(in_stack_fffffffffffff938,(char *)in_stack_fffffffffffff930);
        (anonymous_namespace)::extToString_abi_cxx11_(in_stack_fffffffffffff94c);
        std::operator+(in_stack_fffffffffffff968,in_stack_fffffffffffff960);
        Imf_3_2::addWrapmodes((Header *)local_130,local_2d8);
        std::__cxx11::string::~string(local_2d8);
        std::__cxx11::string::~string(local_338);
        std::__cxx11::string::~string(local_2f8);
        std::__cxx11::string::~string(local_318);
      }
      Imf_3_2::Header::setType((string *)local_130);
      in_stack_fffffffffffffa4c = Imf_3_2::getChunkOffsetTableSize((Header *)local_130);
      local_33c = in_stack_fffffffffffffa4c;
      Imf_3_2::Header::setChunkCount((int)local_130);
      std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                 in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938);
    }
    else {
      in_stack_fffffffffffffa40 =
           (Header *)Imf_3_2::MultiPartInputFile::header((int)local_1a0 + 0x10);
      Imf_3_2::Header::Header(local_378,in_stack_fffffffffffffa40);
      std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                 in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938);
      Imf_3_2::Header::~Header(local_378);
    }
    local_1a0._8_4_ = local_1a0._8_4_ + _S_black;
  } while( true );
}

Assistant:

void
makeTiled (
    const char         inFileName[],
    const char         outFileName[],
    int                partnum,
    LevelMode          mode,
    LevelRoundingMode  roundingMode,
    Compression        compression,
    int                tileSizeX,
    int                tileSizeY,
    const set<string>& doNotFilter,
    Extrapolation      extX,
    Extrapolation      extY,
    bool               verbose)
{
    Image          image0;
    Image          image1;
    Image          image2;
    Header         header;
    FrameBuffer    fb;
    vector<Header> headers;

    //
    // Load the input image
    //

    MultiPartInputFile input (inFileName);
    int                parts = input.parts ();

    for (int p = 0; p < parts; p++)
    {
        if (verbose) cout << "reading file " << inFileName << endl;

        if (p == partnum)
        {
            InputPart in (input, p);
            header = in.header ();
            if (hasEnvmap (header) && mode != ONE_LEVEL)
            {
                //
                // Proper low-pass filtering and subsampling
                // of environment maps is not implemented in
                // this program.
                //

                throw IEX_NAMESPACE::NoImplExc (
                    "This program cannot generate "
                    "multiresolution environment maps.  "
                    "Use exrenvmap instead.");
            }

            image0.resize (header.dataWindow ());

            for (ChannelList::ConstIterator i = header.channels ().begin ();
                 i != header.channels ().end ();
                 ++i)
            {
                const char*    name    = i.name ();
                const Channel& channel = i.channel ();

                if (channel.xSampling != 1 || channel.ySampling != 1)
                {
                    throw IEX_NAMESPACE::InputExc (
                        "Sub-sampled image channels are "
                        "not supported in tiled files.");
                }

                image0.addChannel (name, channel.type);
                image1.addChannel (name, channel.type);
                image2.addChannel (name, channel.type);
                fb.insert (name, image0.channel (name).slice ());
            }

            in.setFrameBuffer (fb);
            in.readPixels (
                header.dataWindow ().min.y, header.dataWindow ().max.y);

            //
            // Generate the header for the output file by modifying
            // the input file's header
            //

            header.setTileDescription (
                TileDescription (tileSizeX, tileSizeY, mode, roundingMode));

            header.compression () = compression;
            header.lineOrder ()   = INCREASING_Y;

            if (mode != ONE_LEVEL)
                addWrapmodes (
                    header, extToString (extX) + "," + extToString (extY));

            //
            // set tileDescription, type, and chunckcount for multipart
            //
            header.setType (TILEDIMAGE);
            int chunkcount = getChunkOffsetTableSize (header);
            header.setChunkCount (chunkcount);

            headers.push_back (header);
        }
        else
        {
            Header h = input.header (p);
            headers.push_back (h);
        }
    }

    //
    // Store the highest-resolution level of the image in the output file
    //

    MultiPartOutputFile output (outFileName, &headers[0], headers.size ());

    for (int p = 0; p < parts; p++)
    {
        if (p == partnum)
        {
            try
            {
                TiledOutputPart out (output, partnum);
                //    TiledOutputFile out (outFileName, header);

                out.setFrameBuffer (fb);

                if (verbose)
                    cout << "writing file " << outFileName
                         << "\n"
                            "level (0, 0)"
                         << endl;

                for (int y = 0; y < out.numYTiles (0); ++y)
                    for (int x = 0; x < out.numXTiles (0); ++x)
                        out.writeTile (x, y, 0);

                //
                // If necessary, generate the lower-resolution mipmap
                // or ripmap levels, and store them in the output file.
                //

                if (mode == MIPMAP_LEVELS)
                {
                    for (int l = 1; l < out.numLevels (); ++l)
                    {
                        image1.resize (out.dataWindowForLevel (l, l - 1));

                        reduceX (
                            header.channels (),
                            doNotFilter,
                            extX,
                            l & 1,
                            image0,
                            image1);

                        image0.resize (out.dataWindowForLevel (l, l));

                        reduceY (
                            header.channels (),
                            doNotFilter,
                            extY,
                            l & 1,
                            image1,
                            image0);

                        if (verbose)
                            cout << "level (" << l << ", " << l << ")" << endl;

                        storeLevel (out, header.channels (), l, l, image0);
                    }
                }

                if (mode == RIPMAP_LEVELS)
                {
                    Image* iptr0 = &image0;
                    Image* iptr1 = &image1;
                    Image* iptr2 = &image2;

                    for (int ly = 0; ly < out.numYLevels (); ++ly)
                    {
                        if (ly < out.numYLevels () - 1)
                        {
                            iptr2->resize (out.dataWindowForLevel (0, ly + 1));

                            reduceY (
                                header.channels (),
                                doNotFilter,
                                extY,
                                ly & 1,
                                *iptr0,
                                *iptr2);
                        }

                        for (int lx = 0; lx < out.numXLevels (); ++lx)
                        {
                            if (lx != 0 || ly != 0)
                            {
                                if (verbose)
                                    cout << "level (" << lx << ", " << ly << ")"
                                         << endl;

                                storeLevel (
                                    out, header.channels (), lx, ly, *iptr0);
                            }

                            if (lx < out.numXLevels () - 1)
                            {
                                iptr1->resize (
                                    out.dataWindowForLevel (lx + 1, ly));

                                reduceX (
                                    header.channels (),
                                    doNotFilter,
                                    extX,
                                    lx & 1,
                                    *iptr0,
                                    *iptr1);

                                swap (iptr0, iptr1);
                            }
                        }

                        swap (iptr2, iptr0);
                    }
                }
            }
            catch (const exception& e)
            {
                cerr << e.what () << endl;
            }
        }
        else
        {
            Header      header = headers[p];
            std::string type   = header.type ();
            if (type == TILEDIMAGE)
            {
                TiledInputPart  in (input, p);
                TiledOutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == SCANLINEIMAGE)
            {
                using std::max;
                InputPart  in (input, p);
                OutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == DEEPSCANLINE)
            {
                DeepScanLineInputPart  in (input, p);
                DeepScanLineOutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == DEEPTILE)
            {
                DeepTiledInputPart  in (input, p);
                DeepTiledOutputPart out (output, p);
                out.copyPixels (in);
            }
        }
    }

    if (verbose) cout << "done." << endl;
}